

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O2

void __thiscall capnp::LocalCallContext::~LocalCallContext(LocalCallContext *this)

{
  kj::Own<kj::PromiseFulfiller<void>_>::dispose(&this->cancelAllowedFulfiller);
  kj::Own<kj::PromiseFulfiller<capnp::AnyPointer::Pipeline>_>::dispose
            (&(this->tailCallPipelineFulfiller).ptr);
  kj::Own<capnp::ClientHook>::dispose(&this->clientRef);
  kj::_::NullableValue<capnp::Response<capnp::AnyPointer>_>::~NullableValue(&(this->response).ptr);
  kj::Own<capnp::MallocMessageBuilder>::dispose(&(this->request).ptr);
  kj::Refcounted::~Refcounted(&this->super_Refcounted);
  return;
}

Assistant:

class LocalCallContext final: public CallContextHook, public kj::Refcounted {
public:
  LocalCallContext(kj::Own<MallocMessageBuilder>&& request, kj::Own<ClientHook> clientRef,
                   kj::Own<kj::PromiseFulfiller<void>> cancelAllowedFulfiller)
      : request(kj::mv(request)), clientRef(kj::mv(clientRef)),
        cancelAllowedFulfiller(kj::mv(cancelAllowedFulfiller)) {}

  AnyPointer::Reader getParams() override {
    KJ_IF_MAYBE(r, request) {
      return r->get()->getRoot<AnyPointer>();
    } else {
      KJ_FAIL_REQUIRE("Can't call getParams() after releaseParams().");
    }
  }
  void releaseParams() override {
    request = nullptr;
  }